

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

void clear_slots_impl(MppBufSlotsImpl *impl)

{
  long *plVar1;
  MppBufSlotEntry *pMVar2;
  pthread_mutex_t *__mutex;
  undefined8 in_RAX;
  long lVar3;
  int index;
  SlotStatus *pSVar4;
  
  pMVar2 = impl->slots;
  for (lVar3 = 0xa0; lVar3 != 0xe0; lVar3 = lVar3 + 0x10) {
    plVar1 = (long *)((long)&impl->lock + lVar3);
    if (plVar1 != *(long **)((long)&impl->lock + lVar3)) {
      _dump_slots("clear_slots_impl",impl);
      if (plVar1 != (long *)*plVar1) {
        in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x31a);
        _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "list_empty(&impl->queue[i])","clear_slots_impl",in_RAX);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0012d58a;
      }
    }
  }
  pSVar4 = &pMVar2->status;
  index = 0;
  do {
    if (impl->buf_count <= index) {
      impl->used_count = 0;
      if (impl->info != (MppFrame)0x0) {
        mpp_frame_deinit(&impl->info);
      }
      if (impl->info_set != (MppFrame)0x0) {
        mpp_frame_deinit(&impl->info_set);
      }
      if (impl->logs != (MppBufSlotLogs *)0x0) {
        mpp_osal_free("buf_slot_logs_deinit",impl->logs);
        impl->logs = (MppBufSlotLogs *)0x0;
      }
      __mutex = (pthread_mutex_t *)impl->lock;
      if (__mutex != (pthread_mutex_t *)0x0) {
        pthread_mutex_destroy(__mutex);
        operator_delete(__mutex,0x28);
      }
      mpp_osal_free("clear_slots_impl",impl->slots);
      mpp_osal_free("clear_slots_impl",impl);
      return;
    }
    if (((uint)*pSVar4 & 1) != 0) {
      in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),0x31e);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "!slot->status.on_used","clear_slots_impl",in_RAX);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0012d58a:
        abort();
      }
      if (((uint)*pSVar4 & 1) != 0) {
        _dump_slots("clear_slots_impl",impl);
        mpp_buf_slot_reset(impl,index);
      }
    }
    index = index + 1;
    pSVar4 = pSVar4 + 0xe;
  } while( true );
}

Assistant:

static void clear_slots_impl(MppBufSlotsImpl *impl)
{
    MppBufSlotEntry *slot = (MppBufSlotEntry *)impl->slots;
    RK_S32 i;

    for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(impl->queue); i++) {
        if (!list_empty(&impl->queue[i]))
            dump_slots(impl);

        mpp_assert(list_empty(&impl->queue[i]));
    }

    for (i = 0; i < impl->buf_count; i++, slot++) {
        mpp_assert(!slot->status.on_used);
        if (slot->status.on_used) {
            dump_slots(impl);
            mpp_buf_slot_reset(impl, i);
        }
    }

    impl->used_count = 0;

    if (impl->info)
        mpp_frame_deinit(&impl->info);

    if (impl->info_set)
        mpp_frame_deinit(&impl->info_set);

    if (impl->logs) {
        buf_slot_logs_deinit(impl->logs);
        impl->logs = NULL;
    }

    if (impl->lock)
        delete impl->lock;

    mpp_free(impl->slots);
    mpp_free(impl);
}